

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_parse_status
pugi::impl::anon_unknown_0::load_stream_data_seek<wchar_t>
          (basic_istream<wchar_t,_std::char_traits<wchar_t>_> *stream,void **out_buffer,
          size_t *out_size)

{
  byte bVar1;
  ulong uVar2;
  streamoff sVar3;
  void *pvVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  size_t actual_length;
  undefined1 local_80 [8];
  auto_deleter<void> buffer;
  size_t max_suffix_size;
  size_t read_length;
  fpos<__mbstate_t> local_50 [16];
  ulong local_40;
  streamoff length;
  pos_type pos;
  size_t *out_size_local;
  void **out_buffer_local;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *stream_local;
  
  auVar6 = std::wistream::tellg();
  _pos = auVar6._8_8_;
  length = auVar6._0_8_;
  std::wistream::seekg((long)stream,_S_beg);
  local_50 = (fpos<__mbstate_t>  [16])std::wistream::tellg();
  local_40 = std::fpos<__mbstate_t>::operator-(local_50,(fpos<__mbstate_t> *)&length);
  std::wistream::seekg(stream,length,_pos);
  uVar2 = std::wios::fail();
  if ((uVar2 & 1) != 0) {
    return status_io_error;
  }
  sVar3 = std::fpos::operator_cast_to_long((fpos *)&length);
  uVar2 = local_40;
  if (sVar3 < 0) {
    return status_io_error;
  }
  if ((long)local_40 < 0) {
    return status_out_of_memory;
  }
  buffer.deleter = (D)0x1;
  pvVar4 = (void *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                             allocate)(local_40 * 4 + 1);
  auto_deleter<void>::auto_deleter
            ((auto_deleter<void> *)local_80,pvVar4,
             (D)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate);
  if (local_80 == (undefined1  [8])0x0) {
    stream_local._4_4_ = status_out_of_memory;
    goto LAB_0012b7b7;
  }
  std::wistream::read((wchar_t *)stream,(long)local_80);
  bVar1 = std::wios::bad();
  if ((bVar1 & 1) == 0) {
    bVar1 = std::wios::eof();
    if ((bVar1 & 1) == 0) {
      bVar1 = std::wios::fail();
      if ((bVar1 & 1) != 0) goto LAB_0012b703;
    }
    uVar5 = std::wistream::gcount();
    if (uVar2 < uVar5) {
      __assert_fail("actual_length <= read_length",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x134b,
                    "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_seek(std::basic_istream<T> &, void **, size_t *) [T = wchar_t]"
                   );
    }
    pvVar4 = auto_deleter<void>::release((auto_deleter<void> *)local_80);
    *out_buffer = pvVar4;
    *out_size = uVar5 << 2;
    stream_local._4_4_ = status_ok;
  }
  else {
LAB_0012b703:
    stream_local._4_4_ = status_io_error;
  }
LAB_0012b7b7:
  auto_deleter<void>::~auto_deleter((auto_deleter<void> *)local_80);
  return stream_local._4_4_;
}

Assistant:

PUGI__FN xml_parse_status load_stream_data_seek(std::basic_istream<T>& stream, void** out_buffer, size_t* out_size)
	{
		// get length of remaining data in stream
		typename std::basic_istream<T>::pos_type pos = stream.tellg();
		stream.seekg(0, std::ios::end);
		std::streamoff length = stream.tellg() - pos;
		stream.seekg(pos);

		if (stream.fail() || pos < 0) return status_io_error;

		// guard against huge files
		size_t read_length = static_cast<size_t>(length);

		if (static_cast<std::streamsize>(read_length) != length || length < 0) return status_out_of_memory;

		size_t max_suffix_size = sizeof(char_t);

		// read stream data into memory (guard against stream exceptions with buffer holder)
		auto_deleter<void> buffer(xml_memory::allocate(read_length * sizeof(T) + max_suffix_size), xml_memory::deallocate);
		if (!buffer.data) return status_out_of_memory;

		stream.read(static_cast<T*>(buffer.data), static_cast<std::streamsize>(read_length));

		// read may set failbit | eofbit in case gcount() is less than read_length (i.e. line ending conversion), so check for other I/O errors
		if (stream.bad() || (!stream.eof() && stream.fail())) return status_io_error;

		// return buffer
		size_t actual_length = static_cast<size_t>(stream.gcount());
		assert(actual_length <= read_length);

		*out_buffer = buffer.release();
		*out_size = actual_length * sizeof(T);

		return status_ok;
	}